

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Functional::NumSamplesParams::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,NumSamplesParams *this,NumSamplesParams *params)

{
  int iVar1;
  char *pcVar2;
  ostringstream *poVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  ostringstream os;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  bVar6 = true;
  lVar5 = 0;
  do {
    iVar1 = this->numSamples[0];
    if (iVar1 != -2) {
      if (bVar6) {
        bVar6 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      if (iVar1 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"texture ",8);
        pcVar2 = *(char **)((long)getDescription::s_names + lVar5);
        sVar4 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar4);
        poVar3 = local_1a8;
      }
      else {
        poVar3 = (ostringstream *)std::ostream::operator<<(local_1a8,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"-sample renderbuffer ",0x15);
        pcVar2 = *(char **)((long)getDescription::s_names + lVar5);
        sVar4 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar2,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," attachment",0xb);
    }
    lVar5 = lVar5 + 8;
    this = (NumSamplesParams *)((long)this + 4);
  } while (lVar5 != 0x18);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string NumSamplesParams::getDescription (const NumSamplesParams& params)
{
	ostringstream os;
	bool first = true;
	static const char* const s_names[] = { "color", "depth", "stencil" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_names) == DE_LENGTH_OF_ARRAY(params.numSamples));

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_names); i++)
	{
		GLsizei ns = params.numSamples[i];

		if (ns == SAMPLES_NONE)
			continue;

		if (first)
			first = false;
		else
			os << ", ";

		if (ns == SAMPLES_TEXTURE)
			os << "texture " << s_names[i] << " attachment";
		else
			os << ns << "-sample renderbuffer " << s_names[i] << " attachment";
	}
	return os.str();
}